

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void OpenSteer::drawXZCheckerboardGrid
               (float size,int subsquares,Vec3 *center,Color *color1,Color *color2)

{
  int in_EDI;
  float in_XMM0_Da;
  Vec3 VVar1;
  int j;
  float q;
  bool flag2;
  int i;
  Vec3 corner;
  float p;
  bool flag1;
  float spacing;
  float half;
  Vec3 *this;
  Color *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  float Y;
  Vec3 *this_00;
  Vec3 *this_01;
  float in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Vec3 *in_stack_ffffffffffffff00;
  undefined8 local_e8;
  float local_e0;
  undefined1 local_d4 [20];
  float local_c0;
  Vec3 local_b8;
  Vec3 local_a4;
  undefined8 local_98;
  float local_90;
  Vec3 local_88;
  undefined8 local_78;
  float local_70;
  Vec3 local_68;
  undefined8 local_58;
  float local_50;
  int local_4c;
  float local_48;
  byte local_41;
  int local_40;
  Vec3 local_3c;
  float local_30;
  byte local_29;
  float local_28;
  float local_24;
  int local_8;
  
  local_24 = in_XMM0_Da / 2.0;
  local_28 = in_XMM0_Da / (float)in_EDI;
  local_8 = in_EDI;
  anon_unknown.dwarf_1485b::beginDoubleSidedDrawing();
  local_29 = 0;
  local_30 = -local_24;
  Vec3::Vec3(&local_3c);
  for (local_40 = 0; local_40 < local_8; local_40 = local_40 + 1) {
    local_48 = -local_24;
    local_41 = local_29;
    for (local_4c = 0; local_41 = local_41 & 1, local_4c < local_8; local_4c = local_4c + 1) {
      this_00 = &local_3c;
      Y = 0.0;
      VVar1 = Vec3::set(this_00,local_30,0.0,local_48);
      local_68.z = VVar1.z;
      local_50 = local_68.z;
      local_68._0_8_ = VVar1._0_8_;
      local_58._0_4_ = local_68.x;
      local_58._4_4_ = local_68.y;
      local_68 = VVar1;
      VVar1 = Vec3::operator+=(in_stack_ffffffffffffff00,
                               (Vec3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                              );
      local_88.z = VVar1.z;
      local_70 = local_88.z;
      local_88._0_8_ = VVar1._0_8_;
      local_78._0_4_ = local_88.x;
      local_78._4_4_ = local_88.y;
      this = &local_a4;
      local_88 = VVar1;
      Vec3::Vec3(this,local_28,Y,Y);
      VVar1 = Vec3::operator+((Vec3 *)in_stack_fffffffffffffed0,this);
      local_b8.z = VVar1.z;
      local_90 = local_b8.z;
      local_b8._0_8_ = VVar1._0_8_;
      local_98._0_4_ = local_b8.x;
      local_98._4_4_ = local_b8.y;
      in_stack_fffffffffffffed0 = (Color *)local_d4;
      local_b8 = VVar1;
      Vec3::Vec3((Vec3 *)in_stack_fffffffffffffed0,local_28,Y,local_28);
      VVar1 = Vec3::operator+((Vec3 *)in_stack_fffffffffffffed0,this);
      local_e0 = VVar1.z;
      local_c0 = local_e0;
      local_e8 = VVar1._0_8_;
      local_d4._12_8_ = local_e8;
      this_01 = (Vec3 *)&stack0xffffffffffffff00;
      Vec3::Vec3(this_01,Y,Y,local_28);
      VVar1 = Vec3::operator+((Vec3 *)in_stack_fffffffffffffed0,this);
      in_stack_fffffffffffffef8 = VVar1.z;
      anon_unknown.dwarf_1485b::iDrawQuadrangle
                (VVar1._0_8_,this_01,this_00,(Vec3 *)CONCAT44(Y,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0);
      local_41 = local_41 ^ 0xff;
      local_48 = local_28 + local_48;
    }
    local_29 = (local_29 ^ 0xff) & 1;
    local_30 = local_28 + local_30;
  }
  anon_unknown.dwarf_1485b::endDoubleSidedDrawing();
  return;
}

Assistant:

void 
OpenSteer::drawXZCheckerboardGrid (const float size,
                                   const int subsquares,
                                   const Vec3& center,
                                   const Color& color1,
                                   const Color& color2)
{
    const float half = size/2;
    const float spacing = size / subsquares;

    beginDoubleSidedDrawing ();
    {
        bool flag1 = false;
        float p = -half;
        Vec3 corner;
        for (int i = 0; i < subsquares; i++)
        {
            bool flag2 = flag1;
            float q = -half;
            for (int j = 0; j < subsquares; j++)
            {
                corner.set (p, 0, q);
                corner += center;
                iDrawQuadrangle (corner,
                                 corner + Vec3 (spacing, 0,       0),
                                 corner + Vec3 (spacing, 0, spacing),
                                 corner + Vec3 (0,       0, spacing),
                                 flag2 ? color1 : color2);
                flag2 = !flag2;
                q += spacing;
            }
            flag1 = !flag1;
            p += spacing;
        }
    }
    endDoubleSidedDrawing ();
}